

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O3

void anon_unknown.dwarf_22bf96::ClearLoadStoreInfoGlobal(VmModule *module)

{
  VariableData *pVVar1;
  bool bVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  byte bVar6;
  long lVar7;
  LoadStoreInfo *pLVar8;
  LoadStoreInfo *pLVar9;
  ulong uVar10;
  byte bVar11;
  
  bVar11 = 0;
  if ((module->loadStoreInfo).count != 0) {
    uVar10 = 0;
    do {
      pLVar9 = (module->loadStoreInfo).data;
      if ((pLVar9[uVar10].loadAddress == (VmConstant *)0x0) ||
         (pVVar1 = (pLVar9[uVar10].loadAddress)->container, pVVar1 == (VariableData *)0x0)) {
        bVar2 = false;
      }
      else {
        bVar2 = IsGlobalScope(pVVar1->scope);
      }
      if ((pLVar9[uVar10].storeAddress == (VmConstant *)0x0) ||
         (pVVar1 = (pLVar9[uVar10].storeAddress)->container, pVVar1 == (VariableData *)0x0)) {
        bVar3 = false;
      }
      else {
        bVar3 = IsGlobalScope(pVVar1->scope);
      }
      if (bVar2 == false) {
        bVar6 = 0;
      }
      else {
        bVar6 = 1;
        if (pLVar9[uVar10].noLoadOrNoContainerAlias == true) {
          bVar6 = (pLVar9[uVar10].loadAddress)->container->isAlloca ^ 1;
        }
      }
      if (bVar3 == false) {
        bVar4 = 0;
LAB_0027e418:
        uVar5 = (module->loadStoreInfo).count;
        if ((bVar6 | bVar4) == 1) goto LAB_0027e430;
        uVar10 = (ulong)((uint)uVar10 + 1);
      }
      else {
        if (pLVar9[uVar10].noStoreOrNoContainerAlias != false) {
          bVar4 = (pLVar9[uVar10].storeAddress)->container->isAlloca ^ 1;
          goto LAB_0027e418;
        }
        uVar5 = (module->loadStoreInfo).count;
LAB_0027e430:
        if (uVar5 == 0) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x172,
                        "T &SmallArray<VmModule::LoadStoreInfo, 32>::back() [T = VmModule::LoadStoreInfo, N = 32]"
                       );
        }
        if (uVar5 <= (uint)uVar10) {
          __assert_fail("index < count",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x199,
                        "T &SmallArray<VmModule::LoadStoreInfo, 32>::operator[](unsigned int) [T = VmModule::LoadStoreInfo, N = 32]"
                       );
        }
        pLVar9 = (module->loadStoreInfo).data;
        bVar2 = pLVar9[uVar5 - 1].noStoreOrNoContainerAlias;
        pLVar9[uVar10].noLoadOrNoContainerAlias = pLVar9[uVar5 - 1].noLoadOrNoContainerAlias;
        pLVar9[uVar10].noStoreOrNoContainerAlias = bVar2;
        pLVar8 = pLVar9 + (uVar5 - 1);
        pLVar9 = pLVar9 + uVar10;
        for (lVar7 = 10; lVar7 != 0; lVar7 = lVar7 + -1) {
          pLVar9->loadInst = pLVar8->loadInst;
          pLVar8 = (LoadStoreInfo *)((long)pLVar8 + ((ulong)bVar11 * -2 + 1) * 8);
          pLVar9 = (LoadStoreInfo *)((long)pLVar9 + ((ulong)bVar11 * -2 + 1) * 8);
        }
        uVar5 = (module->loadStoreInfo).count;
        if (uVar5 == 0) {
          __assert_fail("count > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x183,
                        "void SmallArray<VmModule::LoadStoreInfo, 32>::pop_back() [T = VmModule::LoadStoreInfo, N = 32]"
                       );
        }
        uVar5 = uVar5 - 1;
        (module->loadStoreInfo).count = uVar5;
      }
    } while ((uint)uVar10 < uVar5);
  }
  return;
}

Assistant:

void ClearLoadStoreInfoGlobal(VmModule *module)
	{
		for(unsigned i = 0; i < module->loadStoreInfo.size();)
		{
			VmModule::LoadStoreInfo &el = module->loadStoreInfo[i];

			bool hasLoadFromGlobal = el.loadAddress && el.loadAddress->container && IsGlobalScope(el.loadAddress->container->scope);
			bool hasStoreToGlobal = el.storeAddress && el.storeAddress->container && IsGlobalScope(el.storeAddress->container->scope);

			// If this is an alloca temporary and it cannot be aliased, we can remove it even in the global scope
			if(hasLoadFromGlobal && el.noLoadOrNoContainerAlias && el.loadAddress->container->isAlloca)
				hasLoadFromGlobal = false;

			if(hasStoreToGlobal && el.noStoreOrNoContainerAlias && el.storeAddress->container->isAlloca)
				hasStoreToGlobal = false;

			if(hasLoadFromGlobal || hasStoreToGlobal)
			{
				module->loadStoreInfo[i] = module->loadStoreInfo.back();
				module->loadStoreInfo.pop_back();
			}
			else
			{
				i++;
				continue;
			}
		}
	}